

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

bool __thiscall Debugger::StopDebugging(Debugger *this,JsRuntimeHandle runtime)

{
  JsErrorCode jsErrorCode_00;
  PAL_FILE *pPVar1;
  LPCWSTR pWVar2;
  JsErrorCode jsErrorCode;
  JsErrorCode errorCode;
  void *callbackState;
  JsRuntimeHandle runtime_local;
  Debugger *this_local;
  
  _jsErrorCode = (Debugger *)0x0;
  callbackState = runtime;
  runtime_local = this;
  jsErrorCode_00 = ChakraRTInterface::JsDiagStopDebugging(runtime,(void **)&jsErrorCode);
  if (jsErrorCode_00 == JsErrorDiagNotInDebugMode) {
    this_local._7_1_ = false;
  }
  else if (jsErrorCode_00 == JsNoError) {
    if (_jsErrorCode != this) {
      pPVar1 = PAL_get_stderr(0);
      PAL_fprintf(pPVar1,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Debugger.cpp"
                  ,0x1af,"callbackState == this");
      pPVar1 = PAL_get_stderr(0);
      PAL_fflush(pPVar1);
      DebugBreak();
    }
    this->m_isDetached = true;
    this_local._7_1_ = true;
  }
  else {
    pPVar1 = PAL_get_stderr(0);
    pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode_00);
    PAL_fwprintf(pPVar1,L"ERROR: errorCode failed. JsErrorCode=0x%x (%s)\n",(ulong)jsErrorCode_00,
                 pWVar2);
    pPVar1 = PAL_get_stderr(0);
    PAL_fflush(pPVar1);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Debugger::StopDebugging(JsRuntimeHandle runtime)
{
    void* callbackState = nullptr;

    JsErrorCode errorCode = ChakraRTInterface::JsDiagStopDebugging(runtime, &callbackState);

    if (errorCode == JsErrorCode::JsErrorDiagNotInDebugMode)
    {
        return false;
    }

    IfJsrtErrorFailLogAndRetFalse(errorCode);

    Assert(callbackState == this);

    this->m_isDetached = true;

    return true;
}